

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O3

void C_Ticker(void)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = consoletic + 1;
  if (C_Ticker::lasttic == 0) {
    C_Ticker::lasttic = consoletic;
  }
  consoletic = iVar2;
  if (0 < con_buffersize.Value) {
    FConsoleBuffer::ResizeBuffer(conbuffer,con_buffersize.Value);
  }
  if (ConsoleState == c_rising) {
    iVar2 = (int)((ulong)((long)((screen->super_DSimpleCanvas).super_DCanvas.Height * 2) *
                         -0x51eb851f) >> 0x20);
    ConBottom = ((iVar2 >> 3) - (iVar2 >> 0x1f)) * (consoletic - C_Ticker::lasttic) + ConBottom;
    if (ConBottom < 1) {
      ConsoleState = c_up;
      ConBottom = 0;
    }
  }
  else if (ConsoleState == c_falling) {
    iVar2 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
    ConBottom = ((iVar2 * 2) / 0x19) * (consoletic - C_Ticker::lasttic) + ConBottom;
    iVar2 = iVar2 / 2;
    if (iVar2 <= ConBottom) {
      ConsoleState = c_down;
      ConBottom = iVar2;
    }
  }
  bVar1 = CursorTicker < 2;
  CursorTicker = CursorTicker + -1;
  if (bVar1) {
    cursoron = (bool)(cursoron ^ 1);
    CursorTicker = 0x11;
  }
  C_Ticker::lasttic = consoletic;
  FNotifyBuffer::Tick(&NotifyStrings);
  return;
}

Assistant:

void C_Ticker()
{
	static int lasttic = 0;
	consoletic++;

	if (lasttic == 0)
		lasttic = consoletic - 1;

	if (con_buffersize > 0)
	{
		conbuffer->ResizeBuffer(con_buffersize);
	}

	if (ConsoleState != c_up)
	{
		if (ConsoleState == c_falling)
		{
			ConBottom += (consoletic - lasttic) * (SCREENHEIGHT * 2 / 25);
			if (ConBottom >= SCREENHEIGHT / 2)
			{
				ConBottom = SCREENHEIGHT / 2;
				ConsoleState = c_down;
			}
		}
		else if (ConsoleState == c_rising)
		{
			ConBottom -= (consoletic - lasttic) * (SCREENHEIGHT * 2 / 25);
			if (ConBottom <= 0)
			{
				ConsoleState = c_up;
				ConBottom = 0;
			}
		}
	}

	if (--CursorTicker <= 0)
	{
		cursoron ^= 1;
		CursorTicker = C_BLINKRATE;
	}

	lasttic = consoletic;
	NotifyStrings.Tick();
}